

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  byte *pbVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  byte *pbVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  
  *pResult = 0.0;
  uVar11 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar11 == 1) {
    lVar20 = 1;
    uVar11 = 1;
    pbVar12 = (byte *)z;
  }
  else {
    uVar8 = 3 - uVar11;
    uVar10 = (ulong)uVar8;
    bVar22 = length <= (int)uVar8;
    if (((int)uVar8 < length) &&
       (uVar10 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), z[uVar10] == '\0')) {
      uVar10 = 5 - (ulong)enc;
      do {
        bVar22 = (long)length <= (long)uVar10;
        if ((long)length <= (long)uVar10) goto LAB_00141008;
        uVar1 = uVar10 + 2;
        pcVar2 = z + uVar10;
        uVar10 = uVar1;
      } while (*pcVar2 == '\0');
      uVar10 = (ulong)((int)uVar1 - 2);
    }
LAB_00141008:
    length = (uint)uVar10 ^ 1;
    pbVar12 = (byte *)(z + (uVar11 & 1));
    uVar11 = (uint)bVar22;
    lVar20 = 2;
  }
  pbVar18 = (byte *)(z + length);
  bVar22 = pbVar12 < pbVar18;
  if (!bVar22) {
    return 0;
  }
  bVar3 = *pbVar12;
  while ((""[bVar3] & 1) != 0) {
    pbVar12 = pbVar12 + lVar20;
    bVar22 = pbVar12 < pbVar18;
    if (!bVar22) {
      return 0;
    }
    bVar3 = *pbVar12;
  }
  if (!bVar22) {
    return 0;
  }
  bVar3 = *pbVar12;
  iVar9 = 0;
  lVar13 = 0;
  if ((bVar3 - 0x2b & 0xfd) == 0) {
    lVar13 = lVar20;
  }
  pbVar12 = pbVar12 + lVar13;
  if (pbVar12 < pbVar18) {
    iVar19 = 0;
    lVar13 = 0;
    do {
      if ((9 < (ulong)*pbVar12 - 0x30) || (0xcccccccccccccca < lVar13)) break;
      lVar13 = (long)(char)*pbVar12 + lVar13 * 10 + -0x30;
      pbVar12 = pbVar12 + lVar20;
      iVar19 = iVar19 + 1;
    } while (pbVar12 < pbVar18);
  }
  else {
    lVar13 = 0;
    iVar19 = 0;
  }
  iVar21 = 1;
  bVar22 = pbVar12 < pbVar18;
  if (bVar22) {
    if ((ulong)*pbVar12 - 0x3a < 0xfffffffffffffff6) {
      iVar9 = 0;
    }
    else {
      iVar16 = 0;
      do {
        pbVar12 = pbVar12 + lVar20;
        iVar9 = iVar16 + 1;
        bVar22 = pbVar12 < pbVar18;
        if (!bVar22) {
          iVar19 = iVar19 + iVar16 + 1;
          goto LAB_001411c7;
        }
        iVar16 = iVar9;
      } while (0xfffffffffffffff5 < (ulong)*pbVar12 - 0x3a);
      iVar19 = iVar19 + iVar9;
    }
    if (bVar22) {
      if (*pbVar12 == 0x2e) {
        while ((pbVar12 = pbVar12 + lVar20, pbVar12 < pbVar18 &&
               (0xfffffffffffffff5 < (ulong)*pbVar12 - 0x3a))) {
          if (lVar13 < 0xccccccccccccccb) {
            lVar13 = (long)(char)*pbVar12 + lVar13 * 10 + -0x30;
            iVar9 = iVar9 + -1;
          }
          iVar19 = iVar19 + 1;
        }
      }
      if (pbVar12 < pbVar18) {
        if ((*pbVar12 | 0x20) == 0x65) {
          pbVar12 = pbVar12 + lVar20;
          if (pbVar18 <= pbVar12) {
            iVar16 = 0;
            iVar21 = 1;
            bVar22 = false;
            goto LAB_001411cc;
          }
          iVar21 = 1;
          if (*pbVar12 == 0x2b) {
            pbVar12 = pbVar12 + lVar20;
          }
          else if (*pbVar12 == 0x2d) {
            pbVar12 = pbVar12 + lVar20;
            iVar21 = -1;
          }
          iVar16 = 0;
          if (pbVar12 < pbVar18) {
            uVar10 = (ulong)*pbVar12;
            if (uVar10 - 0x3a < 0xfffffffffffffff6) {
              bVar22 = false;
            }
            else {
              bVar22 = true;
              iVar17 = 0;
              do {
                pbVar12 = pbVar12 + lVar20;
                iVar16 = (char)uVar10 + -0x30 + iVar17 * 10;
                if (9999 < iVar17) {
                  iVar16 = 10000;
                }
              } while ((pbVar12 < pbVar18) &&
                      (uVar10 = (ulong)*pbVar12, iVar17 = iVar16, 0xfffffffffffffff5 < uVar10 - 0x3a
                      ));
            }
          }
          else {
            bVar22 = false;
          }
        }
        else {
          iVar16 = 0;
          iVar21 = 1;
          bVar22 = true;
        }
        while ((pbVar12 < pbVar18 && ((""[*pbVar12] & 1) != 0))) {
          pbVar12 = pbVar12 + lVar20;
        }
        goto LAB_001411cc;
      }
    }
  }
LAB_001411c7:
  iVar16 = 0;
  bVar22 = true;
LAB_001411cc:
  if (lVar13 == 0) {
    if (bVar3 == 0x2d) {
      dVar23 = -0.0;
    }
    else {
      dVar23 = 0.0;
    }
  }
  else {
    uVar15 = iVar16 * iVar21 + iVar9;
    uVar8 = -uVar15;
    if (0 < (int)uVar15) {
      uVar8 = uVar15;
    }
    uVar14 = uVar8;
    if (uVar15 != 0) {
      do {
        uVar14 = uVar8;
        if ((int)uVar15 < 0) {
          uVar10 = lVar13 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) break;
          lVar13 = lVar13 / 10;
        }
        else {
          if (0xccccccccccccccb < lVar13) break;
          lVar13 = lVar13 * 10;
        }
        uVar14 = uVar8 - 1;
        bVar4 = 1 < (int)uVar8;
        uVar8 = uVar14;
      } while (bVar4);
    }
    lVar20 = -lVar13;
    if (bVar3 != 0x2d) {
      lVar20 = lVar13;
    }
    if (uVar14 == 0) {
      dVar23 = (double)lVar20;
    }
    else if ((int)uVar14 < 0x134) {
      fVar6 = 10.0;
      if ((uVar14 & 1) == 0) {
        fVar6 = 1.0;
      }
      if (uVar14 != 1) {
        uVar10 = (ulong)uVar14;
        fVar5 = 10.0;
        fVar7 = fVar6;
        do {
          uVar10 = uVar10 >> 1;
          fVar5 = fVar5 * fVar5;
          fVar6 = fVar7 * fVar5;
          if ((uVar14 & 2) == 0) {
            fVar6 = fVar7;
          }
          bVar4 = 3 < uVar14;
          uVar14 = (uint)uVar10;
          fVar7 = fVar6;
        } while (bVar4);
      }
      if ((int)uVar15 < 0) {
        fVar6 = (float)lVar20 / fVar6;
      }
      else {
        fVar6 = (float)lVar20 * fVar6;
      }
      dVar23 = (double)fVar6;
    }
    else if ((int)uVar14 < 0x156) {
      fVar6 = 10.0;
      if ((uVar14 & 1) == 0) {
        fVar6 = 1.0;
      }
      if (1 < uVar14 - 0x134) {
        fVar5 = 10.0;
        uVar10 = (ulong)(uVar14 - 0x134);
        fVar7 = fVar6;
        do {
          fVar5 = fVar5 * fVar5;
          fVar6 = fVar7 * fVar5;
          if ((uVar10 & 2) == 0) {
            fVar6 = fVar7;
          }
          uVar8 = (uint)uVar10;
          uVar10 = uVar10 >> 1;
          fVar7 = fVar6;
        } while (3 < uVar8);
      }
      if ((int)uVar15 < 0) {
        dVar23 = (double)((float)lVar20 / fVar6) / 1e+308;
      }
      else {
        dVar23 = (double)((float)lVar20 * fVar6) * 1e+308;
      }
    }
    else if ((int)uVar15 < 0) {
      dVar23 = (double)((ulong)(double)lVar20 & 0x8000000000000000);
    }
    else {
      dVar23 = (double)lVar20 * INFINITY;
    }
  }
  if (iVar19 < 1) {
    uVar11 = 0;
  }
  *pResult = dVar23;
  if (pbVar12 != pbVar18) {
    uVar11 = 0;
  }
  if (!bVar22) {
    uVar11 = 0;
  }
  return uVar11;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; nDigits++; d++; }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr; nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}